

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86_avx::forward(Crop_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *__ptr;
  Allocator *pAVar1;
  ulong uVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined8 uVar32;
  int *piVar39;
  int iVar40;
  long lVar41;
  sbyte sVar42;
  sbyte sVar43;
  long lVar44;
  int z;
  uint uVar45;
  int *piVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int q_1;
  int iVar50;
  uint uVar51;
  ulong uVar52;
  int q;
  Option *pOVar53;
  bool bVar54;
  int _outw;
  int _outh;
  int _woffset;
  Mat m;
  int _outc;
  int _hoffset;
  Option *local_108;
  int _outd;
  Mat m_1;
  int _coffset;
  size_t local_a0;
  ulong local_98;
  int local_8c;
  int _doffset;
  int local_84;
  Mat m_2;
  undefined4 uVar26;
  undefined3 uVar28;
  undefined2 uVar30;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined3 uVar35;
  undefined1 uVar36;
  undefined2 uVar37;
  undefined1 uVar38;
  
  iVar48 = bottom_blob->w;
  lVar41 = (long)iVar48;
  iVar47 = bottom_blob->h;
  lVar44 = (long)iVar47;
  local_84 = bottom_blob->d;
  uVar45 = bottom_blob->c;
  local_98 = (ulong)uVar45;
  iVar40 = bottom_blob->elempack;
  m.elempack = 1;
  m.dims = m.elempack;
  m.w = iVar48;
  m.h = iVar47;
  m.d = local_84;
  m.c = m.elempack;
  local_108 = opt;
  if (iVar40 != 4) {
    if (iVar40 != 8) goto switchD_00275a07_default;
    iVar50 = bottom_blob->dims + -1;
    switch(iVar50) {
    case 0:
      m.cstep = lVar41 << 3;
      m.elemsize._0_4_ = 4;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      break;
    case 1:
      m.dims = 2;
      m.h = (int)(lVar44 * 8);
      m.d = 1;
      m.c = 1;
      m.cstep = lVar44 * 8 * lVar41;
      goto LAB_002757f8;
    case 2:
      m.dims = 3;
      m.d = 1;
      lVar44 = lVar44 * lVar41;
      goto LAB_002757a6;
    case 3:
      m.dims = 4;
      lVar44 = lVar44 * lVar41 * (long)local_84;
LAB_002757a6:
      m.c = uVar45 * 8;
      m.cstep = lVar44 + 3U & 0x3ffffffffffffffc;
LAB_002757f8:
      m.elempack = 1;
      m.elemsize._0_4_ = 4;
      break;
    default:
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    local_a0 = bottom_blob->elemsize;
    local_8c = iVar40;
    Crop::resolve_crop_roi
              ((Crop *)((long)&this->_vptr_Crop_x86_avx + (long)this->_vptr_Crop_x86_avx[-3]),&m,
               &_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar46 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar46 != (int *)0x0) {
      LOCK();
      *piVar46 = *piVar46 + -1;
      UNLOCK();
      if (*piVar46 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    sVar42 = 3;
    iVar40 = local_8c;
    switch(iVar50) {
    case 0:
      uVar45 = _outw & 7;
      bVar54 = (_outw & 3U) == 0;
      iVar47 = (uint)bVar54 * 3 + 1;
      if (uVar45 == 0) {
        iVar47 = 8;
      }
      sVar42 = bVar54 * '\x02';
      if (uVar45 == 0) {
        sVar42 = 3;
      }
      uVar2 = (long)_outw % (long)iVar47;
      if (iVar48 != _outw / iVar47 || uVar45 != 0) {
        if (((_outw | _woffset) & 7U) == 0) {
          Mat::create(top_blob,_outw / iVar47,(local_a0 >> 3) << sVar42,8,local_108->blob_allocator)
          ;
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            crop_pack8_avx(bottom_blob,top_blob,0,_woffset / 8);
            return 0;
          }
          return -100;
        }
        break;
      }
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar46 = bottom_blob->refcount;
      if (piVar46 != (int *)0x0) {
        LOCK();
        *piVar46 = *piVar46 + 1;
        UNLOCK();
      }
      piVar46 = top_blob->refcount;
      if (piVar46 == (int *)0x0) goto LAB_0027661c;
      LOCK();
      *piVar46 = *piVar46 + -1;
      UNLOCK();
      if (*piVar46 != 0) goto LAB_0027661c;
      __ptr = top_blob->data;
      pAVar1 = top_blob->allocator;
      goto joined_r0x00275a88;
    case 1:
      sVar43 = ((_outh & 3U) == 0) * '\x02';
      if ((_outh & 7U) == 0) {
        sVar43 = sVar42;
      }
      if (_outw == iVar48) {
        iVar48 = (uint)((_outh & 3U) == 0) * 3 + 1;
        if ((_outh & 7U) == 0) {
          iVar48 = 8;
        }
        uVar2 = (long)_outh % (long)iVar48;
        if (((_outh & 7U) == 0) && (_outh / iVar48 == iVar47)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar46 = bottom_blob->refcount;
          if (piVar46 != (int *)0x0) {
            LOCK();
            *piVar46 = *piVar46 + 1;
            UNLOCK();
          }
          piVar46 = top_blob->refcount;
          if (piVar46 == (int *)0x0) goto LAB_0027661c;
          LOCK();
          *piVar46 = *piVar46 + -1;
          UNLOCK();
          if (*piVar46 != 0) goto LAB_0027661c;
          __ptr = top_blob->data;
          pAVar1 = top_blob->allocator;
          goto joined_r0x00275a88;
        }
      }
      if (((_hoffset | _outh) & 7U) == 0) {
        Mat::create(top_blob,_outw,_outh / 8,(local_a0 >> 3) << sVar43,8,local_108->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          crop_pack8_avx(bottom_blob,top_blob,_hoffset / 8,_woffset);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      uVar52 = local_a0 >> 3;
      sVar43 = ((_outc & 3U) == 0) * '\x02';
      if ((_outc & 7U) == 0) {
        sVar43 = sVar42;
      }
      if (iVar47 == _outh && iVar48 == _outw) {
        iVar50 = (uint)((_outc & 3U) == 0) * 3 + 1;
        if ((_outc & 7U) == 0) {
          iVar50 = 8;
        }
        uVar2 = (long)_outc % (long)iVar50;
        if (((_outc & 7U) == 0) && (_outc / iVar50 == (int)local_98)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar46 = bottom_blob->refcount;
          if (piVar46 != (int *)0x0) {
            LOCK();
            *piVar46 = *piVar46 + 1;
            UNLOCK();
          }
          piVar46 = top_blob->refcount;
          if (piVar46 == (int *)0x0) goto LAB_0027661c;
          LOCK();
          *piVar46 = *piVar46 + -1;
          UNLOCK();
          if (*piVar46 != 0) goto LAB_0027661c;
          __ptr = top_blob->data;
          pAVar1 = top_blob->allocator;
          goto joined_r0x00275a88;
        }
      }
      if (((_coffset | _outc) & 7U) != 0) break;
      iVar40 = (int)((long)_outc / 8);
      uVar2 = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset / 8) * bottom_blob->cstep * uVar2 + (long)bottom_blob->data)
      ;
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar2;
      m.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
      uVar4 = bottom_blob->dims;
      uVar5 = bottom_blob->w;
      uVar6 = bottom_blob->h;
      uVar7 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar2 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar2;
      pOVar53 = local_108;
      m.dims = uVar4;
      m.w = uVar5;
      m.h = uVar6;
      m.d = uVar7;
      m.c = iVar40;
      if (iVar47 != _outh || iVar48 != _outw) {
LAB_00276cb7:
        Mat::create(top_blob,_outw,_outh,iVar40,uVar52 << sVar43,8,pOVar53->blob_allocator);
        iVar40 = -100;
        if ((top_blob->data != (void *)0x0) &&
           (uVar52 = (ulong)top_blob->c, top_blob->cstep * uVar52 != 0)) {
          for (lVar41 = 0; lVar41 < (int)uVar52; lVar41 = lVar41 + 1) {
            m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
            m_1.data = (void *)(m.cstep * lVar41 * m_1.elemsize + (long)m.data);
            m_1.refcount = (int *)0x0;
            m_1.elempack = m.elempack;
            m_1.allocator = m.allocator;
            m_1.h = m.h;
            m_1.d = 1;
            m_1.c = m.d;
            m_1.w = m.w;
            m_1.dims = m.dims + -1;
            m_1.cstep = (m_1.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                        m_1.elemsize;
            if (m.dims == 4) {
              m_1.cstep = (long)m.h * (long)m.w;
            }
            m_2.w = top_blob->w;
            m_2.h = top_blob->h;
            m_2.elemsize = top_blob->elemsize;
            m_2.data = (void *)(top_blob->cstep * lVar41 * m_2.elemsize + (long)top_blob->data);
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount = (int *)0x0;
            m_2.c = top_blob->d;
            m_2.d = 1;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (top_blob->dims == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            crop_pack8_avx(&m_1,&m_2,_hoffset,_woffset);
            uVar52 = (ulong)(uint)top_blob->c;
          }
          iVar40 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outh,(void *)((long)_outc / 8 & 0xffffffff));
        pOVar53 = local_108;
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar46 = top_blob->refcount;
          if (piVar46 != (int *)0x0) {
            LOCK();
            *piVar46 = *piVar46 + -1;
            UNLOCK();
            if (*piVar46 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar40 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar40 = _outc / 8;
          goto LAB_00276cb7;
        }
      }
      piVar46 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar46 == (int *)0x0) {
        return iVar40;
      }
      LOCK();
      *piVar46 = *piVar46 + -1;
      UNLOCK();
      if (*piVar46 != 0) {
        return iVar40;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar40;
      }
      goto LAB_00276571;
    case 3:
      uVar52 = local_a0 >> 3;
      sVar43 = ((_outc & 3U) == 0) * '\x02';
      if ((_outc & 7U) == 0) {
        sVar43 = sVar42;
      }
      if (local_84 == _outd && (iVar47 == _outh && iVar48 == _outw)) {
        iVar50 = (uint)((_outc & 3U) == 0) * 3 + 1;
        if ((_outc & 7U) == 0) {
          iVar50 = 8;
        }
        uVar2 = (long)_outc % (long)iVar50;
        if (((_outc & 7U) == 0) && (_outc / iVar50 == (int)local_98)) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar46 = bottom_blob->refcount;
          if (piVar46 != (int *)0x0) {
            LOCK();
            *piVar46 = *piVar46 + 1;
            UNLOCK();
          }
          piVar46 = top_blob->refcount;
          if (piVar46 == (int *)0x0) goto LAB_0027661c;
          LOCK();
          *piVar46 = *piVar46 + -1;
          UNLOCK();
          if (*piVar46 != 0) goto LAB_0027661c;
          __ptr = top_blob->data;
          pAVar1 = top_blob->allocator;
          goto joined_r0x00275a88;
        }
      }
      if (((_coffset | _outc) & 7U) == 0) {
        iVar50 = _outc / 8;
        uVar2 = bottom_blob->elemsize;
        m.data = (void *)((long)(_coffset / 8) * bottom_blob->cstep * uVar2 +
                         (long)bottom_blob->data);
        iVar40 = -100;
        m.elempack = bottom_blob->elempack;
        m.allocator = bottom_blob->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (undefined4)uVar2;
        m.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
        uVar8 = bottom_blob->dims;
        uVar9 = bottom_blob->w;
        uVar10 = bottom_blob->h;
        uVar11 = bottom_blob->d;
        m.cstep = ((long)bottom_blob->d * uVar2 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf
                  & 0xfffffffffffffff0) / uVar2;
        pOVar53 = local_108;
        m.dims = uVar8;
        m.w = uVar9;
        m.h = uVar10;
        m.d = uVar11;
        m.c = iVar50;
        if (local_84 != _outd || (iVar47 != _outh || iVar48 != _outw)) {
LAB_00276f7c:
          Mat::create(top_blob,_outw,_outh,_outd,iVar50,uVar52 << sVar43,8,pOVar53->blob_allocator);
          if ((top_blob->data != (void *)0x0) &&
             (uVar52 = (ulong)top_blob->c, top_blob->cstep * uVar52 != 0)) {
            for (lVar41 = 0; lVar41 < (int)uVar52; lVar41 = lVar41 + 1) {
              for (lVar44 = 0; lVar44 < _outd; lVar44 = lVar44 + 1) {
                m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                m_1.cstep = (long)m.h * (long)m.w;
                m_1.data = (void *)((long)m.data +
                                   (long)(_doffset + (int)lVar44) * m_1.elemsize * m_1.cstep +
                                   m.cstep * lVar41 * m_1.elemsize);
                m_1.refcount = (int *)0x0;
                m_1.elempack = m.elempack;
                m_1.allocator = m.allocator;
                m_2.dims = 2;
                m_1.w = m.w;
                m_1.dims = 2;
                m_1.h = m.h;
                m_1.d = 1;
                m_1.c = 1;
                m_2.w = top_blob->w;
                m_2.h = top_blob->h;
                m_2.elemsize = top_blob->elemsize;
                m_2.elempack = top_blob->elempack;
                m_2.allocator = top_blob->allocator;
                m_2.cstep = (long)m_2.h * (long)m_2.w;
                m_2.data = (void *)((long)top_blob->data +
                                   lVar44 * m_2.elemsize * m_2.cstep +
                                   top_blob->cstep * lVar41 * m_2.elemsize);
                m_2.refcount = (int *)0x0;
                m_2.d = 1;
                m_2.c = 1;
                crop_pack8_avx(&m_1,&m_2,_hoffset,_woffset);
              }
              uVar52 = (ulong)(uint)top_blob->c;
            }
            iVar40 = 0;
          }
        }
        else {
          Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,(void *)(ulong)(uint)_outh);
          pOVar53 = local_108;
          if (&m_1 != top_blob) {
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + 1;
              UNLOCK();
            }
            piVar46 = top_blob->refcount;
            if (piVar46 != (int *)0x0) {
              LOCK();
              *piVar46 = *piVar46 + -1;
              UNLOCK();
              if (*piVar46 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = m_1.data;
            top_blob->refcount = m_1.refcount;
            top_blob->elemsize = m_1.elemsize;
            top_blob->elempack = m_1.elempack;
            top_blob->allocator = m_1.allocator;
            top_blob->dims = m_1.dims;
            top_blob->w = m_1.w;
            top_blob->h = m_1.h;
            top_blob->d = m_1.d;
            top_blob->c = m_1.c;
            top_blob->cstep = m_1.cstep;
          }
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            iVar50 = _outc / 8;
            goto LAB_00276f7c;
          }
        }
        piVar46 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar46 == (int *)0x0) {
          return iVar40;
        }
        LOCK();
        *piVar46 = *piVar46 + -1;
        UNLOCK();
        if (*piVar46 != 0) {
          return iVar40;
        }
        if (m.allocator != (Allocator *)0x0) {
          (*(m.allocator)->_vptr_Allocator[3])();
          return iVar40;
        }
        goto LAB_00276571;
      }
    }
    goto switchD_00275a07_default;
  }
  uVar51 = bottom_blob->dims - 1;
  switch(uVar51) {
  case 0:
    m.cstep = lVar41 << 2;
    m.elemsize._0_4_ = 4;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    break;
  case 1:
    m.dims = 2;
    m.h = (int)(lVar44 * 4);
    m.d = 1;
    m.c = 1;
    m.cstep = lVar44 * 4 * lVar41;
    goto LAB_002758a4;
  case 2:
    m.dims = 3;
    m.d = 1;
    lVar44 = lVar44 * lVar41;
    goto LAB_00275853;
  case 3:
    m.dims = 4;
    lVar44 = lVar44 * lVar41 * (long)local_84;
LAB_00275853:
    m.c = uVar45 * 4;
    m.cstep = lVar44 + 3U & 0x3ffffffffffffffc;
LAB_002758a4:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  piVar46 = &_doffset;
  local_a0 = bottom_blob->elemsize;
  local_8c = iVar40;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86_avx + (long)this->_vptr_Crop_x86_avx[-3]),&m,
             &_woffset,&_hoffset,piVar46,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar39 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar39 != (int *)0x0) {
    LOCK();
    *piVar39 = *piVar39 + -1;
    UNLOCK();
    if (*piVar39 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  pOVar53 = local_108;
  iVar40 = local_8c;
  if (3 < uVar51) goto switchD_00275a07_default;
  iVar50 = _outc >> 2;
  switch(uVar51) {
  case 0:
    uVar45 = _outw & 3;
    iVar47 = (uint)(uVar45 == 0) * 3 + 1;
    uVar2 = (long)_outw % (long)iVar47;
    if (iVar48 == _outw / iVar47 && uVar45 == 0) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar46 = bottom_blob->refcount;
      if (piVar46 != (int *)0x0) {
        LOCK();
        *piVar46 = *piVar46 + 1;
        UNLOCK();
      }
      piVar46 = top_blob->refcount;
      if (piVar46 == (int *)0x0) goto LAB_0027661c;
      LOCK();
      *piVar46 = *piVar46 + -1;
      UNLOCK();
      if (*piVar46 != 0) goto LAB_0027661c;
      __ptr = top_blob->data;
      pAVar1 = top_blob->allocator;
joined_r0x00275a88:
      if (pAVar1 == (Allocator *)0x0) {
        free(__ptr);
      }
      else {
        (*pAVar1->_vptr_Allocator[3])(pAVar1,__ptr,uVar2 & 0xffffffff);
      }
LAB_0027661c:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar46 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar46;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar48 = bottom_blob->w;
      iVar47 = bottom_blob->h;
      iVar40 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar48;
      top_blob->h = iVar47;
      top_blob->d = iVar40;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(top_blob,_outw / iVar47,(local_a0 >> 2) << (uVar45 == 0) * '\x02',iVar47,
                  local_108->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        crop_pack4_sse(bottom_blob,top_blob,0,_woffset / 4);
        return 0;
      }
      return -100;
    }
    break;
  case 1:
    if (_outw == iVar48) {
      iVar48 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar2 = (long)_outh % (long)iVar48;
      if (((_outh & 3U) == 0) && (_outh / iVar48 == iVar47)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar46 = bottom_blob->refcount;
        if (piVar46 != (int *)0x0) {
          LOCK();
          *piVar46 = *piVar46 + 1;
          UNLOCK();
        }
        piVar46 = top_blob->refcount;
        if (piVar46 == (int *)0x0) goto LAB_0027661c;
        LOCK();
        *piVar46 = *piVar46 + -1;
        UNLOCK();
        if (*piVar46 != 0) goto LAB_0027661c;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x00275a88;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(top_blob,_outw,_outh >> 2,(local_a0 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_108->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        crop_pack4_sse(bottom_blob,top_blob,_hoffset / 4,_woffset);
        return 0;
      }
      return -100;
    }
    break;
  case 2:
    uVar45 = _outc & 3;
    uVar52 = local_a0 >> 2;
    bVar54 = iVar47 == _outh;
    bVar3 = iVar48 == _outw;
    if (bVar54 && bVar3) {
      iVar48 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar2 = (long)_outc % (long)iVar48;
      if (((_outc & 3U) == 0) && (_outc / iVar48 == (int)local_98)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar46 = bottom_blob->refcount;
        if (piVar46 != (int *)0x0) {
          LOCK();
          *piVar46 = *piVar46 + 1;
          UNLOCK();
        }
        piVar46 = top_blob->refcount;
        if (piVar46 == (int *)0x0) goto LAB_0027661c;
        LOCK();
        *piVar46 = *piVar46 + -1;
        UNLOCK();
        if (*piVar46 != 0) goto LAB_0027661c;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x00275a88;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) break;
    uVar2 = bottom_blob->elemsize;
    m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar2 + (long)bottom_blob->data);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)uVar2;
    m.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
    uVar12 = bottom_blob->dims;
    uVar13 = bottom_blob->w;
    uVar14 = bottom_blob->h;
    uVar15 = bottom_blob->d;
    m.cstep = ((long)bottom_blob->d * uVar2 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
              0xfffffffffffffff0) / uVar2;
    m.dims = uVar12;
    m.w = uVar13;
    m.h = uVar14;
    m.d = uVar15;
    m.c = iVar50;
    if (bVar54 && bVar3) {
      Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outh,
                 (void *)CONCAT71((int7)((ulong)piVar46 >> 8),bVar54 && bVar3));
      if (&m_1 != top_blob) {
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + 1;
          UNLOCK();
        }
        piVar46 = top_blob->refcount;
        if (piVar46 != (int *)0x0) {
          LOCK();
          *piVar46 = *piVar46 + -1;
          UNLOCK();
          if (*piVar46 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = m_1.data;
        top_blob->refcount = m_1.refcount;
        top_blob->elemsize = m_1.elemsize;
        top_blob->elempack = m_1.elempack;
        top_blob->allocator = m_1.allocator;
        top_blob->dims = m_1.dims;
        top_blob->w = m_1.w;
        top_blob->h = m_1.h;
        top_blob->d = m_1.d;
        top_blob->c = m_1.c;
        top_blob->cstep = m_1.cstep;
      }
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar40 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
      goto LAB_0027673c;
    }
    else {
LAB_0027673c:
      Mat::create(top_blob,_outw,_outh,_outc / 4,uVar52 << (uVar45 == 0) * '\x02',4,
                  pOVar53->blob_allocator);
      iVar40 = -100;
      if ((top_blob->data != (void *)0x0) &&
         (uVar52 = (ulong)top_blob->c, top_blob->cstep * uVar52 != 0)) {
        for (lVar41 = 0; lVar41 < (int)uVar52; lVar41 = lVar41 + 1) {
          m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
          m_1.data = (void *)(m.cstep * lVar41 * m_1.elemsize + (long)m.data);
          m_1.refcount = (int *)0x0;
          m_1.elempack = m.elempack;
          m_1.allocator = m.allocator;
          m_1.h = m.h;
          m_1.d = 1;
          m_1.c = m.d;
          m_1.w = m.w;
          m_1.dims = m.dims + -1;
          m_1.cstep = (m_1.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                      m_1.elemsize;
          if (m.dims == 4) {
            m_1.cstep = (long)m.h * (long)m.w;
          }
          m_2.w = top_blob->w;
          m_2.h = top_blob->h;
          m_2.elemsize = top_blob->elemsize;
          m_2.data = (void *)(top_blob->cstep * lVar41 * m_2.elemsize + (long)top_blob->data);
          m_2.elempack = top_blob->elempack;
          m_2.allocator = top_blob->allocator;
          m_2.refcount = (int *)0x0;
          m_2.c = top_blob->d;
          m_2.d = 1;
          m_2.dims = top_blob->dims + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (top_blob->dims == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
          uVar52 = (ulong)(uint)top_blob->c;
        }
        iVar40 = 0;
      }
    }
    piVar46 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar46 == (int *)0x0) {
      return iVar40;
    }
    LOCK();
    *piVar46 = *piVar46 + -1;
    UNLOCK();
    if (*piVar46 != 0) {
      return iVar40;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar40;
    }
    goto LAB_00276571;
  case 3:
    uVar45 = _outc & 3;
    uVar52 = local_a0 >> 2;
    if (local_84 == _outd && (iVar47 == _outh && iVar48 == _outw)) {
      iVar49 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar2 = (long)_outc % (long)iVar49;
      if (((_outc & 3U) == 0) && (_outc / iVar49 == (int)local_98)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar46 = bottom_blob->refcount;
        if (piVar46 != (int *)0x0) {
          LOCK();
          *piVar46 = *piVar46 + 1;
          UNLOCK();
        }
        piVar46 = top_blob->refcount;
        if (piVar46 == (int *)0x0) goto LAB_0027661c;
        LOCK();
        *piVar46 = *piVar46 + -1;
        UNLOCK();
        if (*piVar46 != 0) goto LAB_0027661c;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x00275a88;
      }
    }
    if (((_coffset | _outc) & 3U) == 0) {
      uVar2 = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar2 + (long)bottom_blob->data
                       );
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar2;
      m.elemsize._4_4_ = (undefined4)(uVar2 >> 0x20);
      uVar16 = bottom_blob->dims;
      uVar17 = bottom_blob->w;
      uVar18 = bottom_blob->h;
      uVar19 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar2 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar2;
      m.dims = uVar16;
      m.w = uVar17;
      m.h = uVar18;
      m.d = uVar19;
      m.c = iVar50;
      if (local_84 != _outd || (iVar47 != _outh || iVar48 != _outw)) {
LAB_00276a04:
        Mat::create(top_blob,_outw,_outh,_outd,_outc / 4,uVar52 << (uVar45 == 0) * '\x02',4,
                    pOVar53->blob_allocator);
        iVar40 = -100;
        if ((top_blob->data != (void *)0x0) &&
           (uVar52 = (ulong)top_blob->c, top_blob->cstep * uVar52 != 0)) {
          for (lVar41 = 0; lVar41 < (int)uVar52; lVar41 = lVar41 + 1) {
            for (lVar44 = 0; lVar44 < _outd; lVar44 = lVar44 + 1) {
              m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              m_1.cstep = (long)m.h * (long)m.w;
              m_1.data = (void *)((long)m.data +
                                 (long)(_doffset + (int)lVar44) * m_1.elemsize * m_1.cstep +
                                 m.cstep * lVar41 * m_1.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_2.dims = 2;
              m_1.w = m.w;
              m_1.dims = 2;
              m_1.h = m.h;
              m_1.d = 1;
              m_1.c = 1;
              m_2.w = top_blob->w;
              m_2.h = top_blob->h;
              m_2.elemsize = top_blob->elemsize;
              m_2.elempack = top_blob->elempack;
              m_2.allocator = top_blob->allocator;
              m_2.cstep = (long)m_2.h * (long)m_2.w;
              m_2.data = (void *)((long)top_blob->data +
                                 lVar44 * m_2.elemsize * m_2.cstep +
                                 top_blob->cstep * lVar41 * m_2.elemsize);
              m_2.refcount = (int *)0x0;
              m_2.d = 1;
              m_2.c = 1;
              crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
            }
            uVar52 = (ulong)(uint)top_blob->c;
          }
          iVar40 = 0;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,(void *)(ulong)(uint)_outh);
        pOVar53 = local_108;
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar46 = top_blob->refcount;
          if (piVar46 != (int *)0x0) {
            LOCK();
            *piVar46 = *piVar46 + -1;
            UNLOCK();
            if (*piVar46 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar40 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
        goto LAB_00276a04;
      }
      piVar46 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar46 == (int *)0x0) {
        return iVar40;
      }
      LOCK();
      *piVar46 = *piVar46 + -1;
      UNLOCK();
      if (*piVar46 != 0) {
        return iVar40;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar40;
      }
      goto LAB_00276571;
    }
  }
switchD_00275a07_default:
  pOVar53 = local_108;
  piVar46 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar20 = bottom_blob->dims;
  uVar21 = bottom_blob->w;
  uVar22 = bottom_blob->h;
  uVar23 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar46 != (int *)0x0) {
    LOCK();
    *piVar46 = *piVar46 + 1;
    UNLOCK();
  }
  m.dims = uVar20;
  m.w = uVar21;
  m.h = uVar22;
  m.d = uVar23;
  if (iVar40 != 1) {
    m_1.data = *(void **)local_108;
    m_1.elemsize = (size_t)local_108->workspace_allocator;
    m_1.elempack = local_108->openmp_blocktime;
    m_1._28_1_ = local_108->use_winograd_convolution;
    m_1._29_1_ = local_108->use_sgemm_convolution;
    m_1._30_1_ = local_108->use_int8_inference;
    m_1._31_1_ = local_108->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&local_108->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&local_108->use_shader_pack8;
    uVar24 = local_108->flush_denormals;
    uVar25 = local_108->use_local_pool_allocator;
    uVar27 = local_108->use_shader_local_memory;
    uVar29 = local_108->use_cooperative_matrix;
    uVar31 = local_108->use_winograd23_convolution;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar26 = CONCAT31(uVar28,uVar25);
    uVar32._0_1_ = local_108->use_winograd43_convolution;
    uVar32._1_1_ = local_108->use_winograd63_convolution;
    uVar32._2_1_ = local_108->use_reserved_6;
    uVar32._3_1_ = local_108->use_reserved_7;
    uVar33 = local_108->use_reserved_8;
    uVar34 = local_108->use_reserved_9;
    uVar36 = local_108->use_reserved_10;
    uVar38 = local_108->use_reserved_11;
    uVar37 = CONCAT11(uVar38,uVar36);
    uVar35 = CONCAT21(uVar37,uVar34);
    uVar32._4_4_ = CONCAT31(uVar35,uVar33);
    m_1.c = (int)uVar32;
    m_1.refcount = (int *)local_108->workspace_allocator;
    m_1.h = uVar24;
    m_1.d = uVar26;
    m_1._60_4_ = uVar32._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar40 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86_avx +
                                 (long)this->_vptr_Crop_x86_avx[-3]),&m,top_blob,pOVar53);
  piVar46 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar46 != (int *)0x0) {
    LOCK();
    *piVar46 = *piVar46 + -1;
    UNLOCK();
    if (*piVar46 == 0) {
      if (m.allocator == (Allocator *)0x0) {
LAB_00276571:
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int Crop_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}